

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O3

bool __thiscall HighsCutGeneration::separateLiftedMixedIntegerCover(HighsCutGeneration *this)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  pointer pHVar4;
  ulong uVar5;
  double *pdVar6;
  int iVar7;
  pointer piVar8;
  undefined1 uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  pointer pHVar10;
  pointer __src;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  HighsCDouble *pHVar17;
  size_type __new_size;
  size_type __new_size_00;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  HighsCDouble HVar28;
  HighsCDouble ulminusetaplusone_1;
  HighsCDouble al;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> m;
  HighsCDouble ulminusetaplusone;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> u;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> a;
  HighsCDouble uih;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coverflag;
  HighsCDouble local_238;
  double local_220;
  undefined1 local_218 [16];
  double local_208;
  undefined8 uStack_200;
  HighsCDouble local_1f8;
  double local_1e8;
  ulong uStack_1e0;
  HighsCDouble local_1d0;
  double local_1c0;
  undefined1 local_1b8 [16];
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_1a8;
  undefined1 local_188 [16];
  double local_178;
  long local_170;
  HighsCDouble local_168;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_158;
  double local_140;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_138;
  double local_120;
  double local_118;
  double local_110;
  vector<int,_std::allocator<int>_> *local_108;
  HighsCDouble local_100;
  uint local_ec;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_90;
  double local_88;
  long local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  this->integralSupport = false;
  this->integralCoefficients = false;
  uVar15 = (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_78,(long)this->rowlen);
  begin._M_current =
       (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  end._M_current =
       (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (begin._M_current != end._M_current) {
    do {
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[*begin._M_current] = '\x01';
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != end._M_current);
    begin._M_current =
         (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start;
    end._M_current =
         (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
  }
  uVar12 = uVar15 >> 2;
  if (begin._M_current != end._M_current) {
    uVar5 = (long)end._M_current - (long)begin._M_current >> 2;
    iVar7 = 0;
    if (1 < uVar5) {
      iVar7 = 0;
      do {
        uVar5 = (long)uVar5 >> 1;
        iVar7 = iVar7 + 1;
      } while (1 < uVar5);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedIntegerCover()::__0,true>
              (begin,end,(anon_class_8_1_8991fb9c)this,iVar7,true);
  }
  local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = (int)uVar12;
  __new_size = (size_type)iVar7;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_138,__new_size);
  __new_size_00 = (long)(uVar15 * 0x40000000 + 0x100000000) >> 0x20;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_158,__new_size_00);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_1a8,__new_size_00);
  if (iVar7 == 0) {
    dVar23 = 0.0;
    dVar20 = 0.0;
    dVar25 = 0.0;
    dVar26 = 0.0;
  }
  else {
    dVar26 = 0.0;
    lVar16 = 0;
    uVar15 = 0;
    dVar25 = 0.0;
    dVar20 = 0.0;
    dVar23 = 0.0;
    do {
      iVar1 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15];
      local_1b8._0_8_ = dVar25;
      *(double *)
       ((long)&(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->hi + lVar16) = dVar25;
      local_218._0_8_ = dVar26;
      *(double *)
       ((long)&(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->lo + lVar16) = dVar26;
      *(double *)
       ((long)&(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->hi + lVar16) = dVar23;
      *(double *)
       ((long)&(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->lo + lVar16) = dVar20;
      *(double *)
       ((long)&(local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->hi + lVar16) = this->vals[iVar1];
      *(undefined8 *)
       ((long)&(local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->lo + lVar16) = 0;
      local_220 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar1];
      local_208 = dVar20;
      local_1e8 = dVar23;
      HVar28 = HighsCDouble::operator*
                         ((HighsCDouble *)
                          ((long)&(local_138.
                                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->hi + lVar16),local_220
                         );
      dVar25 = (double)local_1b8._0_8_ + local_220;
      dVar26 = (double)local_218._0_8_ +
               (local_220 - (dVar25 - (dVar25 - local_220))) +
               ((double)local_1b8._0_8_ - (dVar25 - local_220));
      dVar20 = HVar28.hi;
      dVar23 = local_1e8 + dVar20;
      dVar20 = HVar28.lo +
               local_208 + (local_1e8 - (dVar23 - dVar20)) + (dVar20 - (dVar23 - (dVar23 - dVar20)))
      ;
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x10;
    } while ((uVar12 & 0xffffffff) != uVar15);
  }
  local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start[__new_size].hi = dVar25;
  local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start[__new_size].lo = dVar26;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start[__new_size].hi = dVar23;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start[__new_size].lo = dVar20;
  if (iVar7 == 0) {
    uVar9 = 0;
  }
  else {
    local_108 = &this->cover;
    bVar3 = true;
    local_d8 = 2.12199579047121e-314;
    uVar15 = 0;
    local_140 = 2.12199579047121e-314;
    local_1c0 = 0.0;
    do {
      iVar7 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15];
      dVar20 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar7];
      dVar25 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar7];
      dVar23 = this->feastol;
      dVar26 = dVar20 - dVar23;
      if ((dVar25 < dVar26) || (bVar3)) {
        dVar24 = this->vals[iVar7];
        dVar27 = dVar20 * dVar24;
        dVar22 = (this->lambda).hi;
        dVar21 = dVar27 - dVar22;
        dVar22 = ((dVar27 - (dVar22 + dVar21)) + (-dVar22 - (dVar21 - (dVar22 + dVar21)))) -
                 (this->lambda).lo;
        if ((dVar23 * 10.0 < dVar21 + dVar22) && (dVar23 * 1000.0 <= ABS(dVar24))) {
          uStack_e0 = 0;
          local_1b8._0_8_ = dVar25;
          local_238.hi = dVar21;
          local_238.lo = dVar22;
          local_220 = dVar26;
          local_1e8 = dVar20;
          local_e8 = dVar27;
          HighsCDouble::operator/=(&local_238,dVar24);
          local_208 = local_238.hi + local_238.lo;
          local_218._0_8_ = this->feastol;
          dVar20 = trunc(local_208);
          dVar23 = ABS(local_208 - dVar20);
          dVar20 = 1.0 - dVar23;
          if (dVar23 <= 1.0 - dVar23) {
            dVar20 = dVar23;
          }
          if ((double)local_218._0_8_ < dVar20) {
            dVar20 = ceil(local_208);
            local_218._8_4_ = extraout_XMM0_Dc;
            local_218._0_8_ = dVar20;
            local_218._12_4_ = extraout_XMM0_Dd;
            dVar23 = local_1e8 - dVar20;
            local_238.hi = dVar23 + 1.0;
            local_238.lo = (1.0 - (local_238.hi - dVar23)) +
                           (dVar23 - (local_238.hi - (local_238.hi - dVar23))) +
                           (-dVar20 - (dVar23 - local_1e8)) +
                           (local_1e8 - (dVar23 - (dVar23 - local_1e8))) + 0.0;
            HVar28 = HighsCDouble::operator*(&local_238,this->vals[iVar7]);
            piVar2 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            piVar8 = piVar2;
            if (0 < (long)uVar5) {
              dVar20 = HVar28.hi + HVar28.lo;
              do {
                uVar11 = uVar5 >> 1;
                pdVar6 = this->vals + piVar8[uVar11];
                if (dVar20 < *pdVar6 || dVar20 == *pdVar6) {
                  piVar8 = piVar8 + uVar11 + 1;
                  uVar11 = ~uVar11 + uVar5;
                }
                uVar5 = uVar11;
              } while (0 < (long)uVar11);
            }
            dVar22 = (double)((ulong)((long)piVar8 - (long)piVar2) >> 2);
            lVar16 = ((long)piVar8 - (long)piVar2) * 0x40000000 >> 0x1c;
            dVar20 = *(double *)
                      ((long)&(local_1a8.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start)->hi + lVar16);
            dVar23 = *(double *)
                      ((long)&(local_1a8.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start)->lo + lVar16);
            dVar24 = dVar20;
            if ((long)uVar15 < (long)SUB84(dVar22,0)) {
              dVar24 = dVar20 - local_e8;
              dVar23 = dVar23 + (dVar20 - (local_e8 + dVar24)) +
                                (-local_e8 - (dVar24 - (local_e8 + dVar24)));
            }
            dVar21 = (double)local_218._0_8_ * this->vals[iVar7];
            dVar20 = dVar24 + dVar21;
            dVar20 = (dVar21 - (dVar20 - dVar24)) + (dVar24 - (dVar20 - (dVar20 - dVar24))) + dVar23
                     + dVar20;
            if ((local_1c0 < dVar20) || (((double)local_1b8._0_8_ < local_220 && (bVar3)))) {
              local_d8 = (double)(uVar15 & 0xffffffff);
              local_1c0 = dVar20;
              local_140 = dVar22;
              bVar3 = dVar25 >= dVar26;
            }
          }
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uVar12 & 0xffffffff));
    uVar14 = SUB84(local_d8,0);
    uVar15 = CONCAT71((int7)((uVar12 & 0xffffffff) >> 8),uVar14 != 0xffffffff);
    if (uVar14 != 0xffffffff) {
      local_ec = (uint)uVar15;
      iVar7 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar14];
      local_1d0.hi = this->vals[iVar7];
      local_1d0.lo = 0.0;
      local_218._0_8_ =
           (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar7];
      local_218._8_8_ = 0;
      HVar28 = HighsCDouble::operator*(&local_1d0,(double)local_218._0_8_);
      local_220 = HVar28.lo;
      local_1b8._0_8_ = HVar28.hi;
      local_1b8._12_4_ = extraout_XMM0_Dd_00;
      local_1b8._8_4_ = extraout_XMM0_Dc_00;
      dVar20 = (this->lambda).hi;
      local_1e8 = (double)local_1b8._0_8_ - dVar20;
      local_208 = ((-dVar20 - (local_1e8 - (double)local_1b8._0_8_)) +
                   ((double)local_1b8._0_8_ - (local_1e8 - (local_1e8 - (double)local_1b8._0_8_))) +
                  local_220) - (this->lambda).lo;
      uStack_200 = 0x8000000000000000;
      iVar7 = SUB84(local_140,0);
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_138,(long)iVar7);
      std::vector<int,_std::allocator<int>_>::resize(local_108,(long)iVar7);
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_158,(long)(iVar7 + 1))
      ;
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_1a8,(long)(iVar7 + 1))
      ;
      if ((int)uVar14 < iVar7) {
        pHVar10 = local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)(int)uVar14 + 1;
        if (pHVar10 !=
            local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start + (int)uVar14,pHVar10,
                  (long)local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pHVar10);
        }
        local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        piVar2 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        __src = piVar2 + (long)(int)uVar14 + 1;
        if (__src != piVar8) {
          memmove(piVar2 + (int)uVar14,__src,(long)piVar8 - (long)__src);
          piVar8 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar8 + -1;
        pHVar10 = local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)(int)uVar14 + 2;
        if (pHVar10 !=
            local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)(int)uVar14 + 1,pHVar10,
                  (long)local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pHVar10);
        }
        local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        pHVar10 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)(int)uVar14 + 2;
        if (pHVar10 !=
            local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)(int)uVar14 + 1,pHVar10,
                  (long)local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pHVar10);
        }
        local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        if ((int)(uVar14 + 1) < iVar7) {
          uVar15 = (long)(int)(uVar14 + 1) << 4 | 8;
          iVar7 = ~uVar14 + iVar7;
          do {
            dVar20 = *(double *)
                      ((long)local_158.
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                             .super__Vector_impl_data._M_start + (uVar15 - 8));
            dVar25 = dVar20 - (double)local_218._0_8_;
            *(double *)
             ((long)local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start + (uVar15 - 8)) = dVar25;
            *(double *)
             ((long)&(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_start)->hi + uVar15) =
                 (dVar20 - ((double)local_218._0_8_ + dVar25)) +
                 (-(double)local_218._0_8_ - (dVar25 - ((double)local_218._0_8_ + dVar25))) +
                 *(double *)
                  ((long)&(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                           ._M_impl.super__Vector_impl_data._M_start)->hi + uVar15);
            dVar20 = *(double *)
                      ((long)local_1a8.
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                             .super__Vector_impl_data._M_start + (uVar15 - 8));
            dVar25 = dVar20 - (double)local_1b8._0_8_;
            *(double *)
             ((long)local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start + (uVar15 - 8)) = dVar25;
            *(double *)
             ((long)&(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_start)->hi + uVar15) =
                 ((dVar20 - ((double)local_1b8._0_8_ + dVar25)) +
                  (-(double)local_1b8._0_8_ - (dVar25 - ((double)local_1b8._0_8_ + dVar25))) +
                 *(double *)
                  ((long)&(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                           ._M_impl.super__Vector_impl_data._M_start)->hi + uVar15)) - local_220;
            uVar15 = uVar15 + 0x10;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
      }
      uVar15 = (long)local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_238.hi = local_1e8;
      local_238.lo = local_208;
      HighsCDouble::operator/=(&local_238,&local_1d0);
      local_220 = local_238.hi + local_238.lo;
      dVar20 = ceil(local_220);
      local_1b8._8_4_ = extraout_XMM0_Dc_01;
      local_1b8._0_8_ = dVar20;
      local_1b8._12_4_ = extraout_XMM0_Dd_01;
      dVar20 = floor(local_220);
      local_238.hi = local_1d0.hi;
      local_238.lo = local_1d0.lo;
      HVar28 = HighsCDouble::operator*(&local_238,dVar20);
      local_1f8.hi = local_1e8 - HVar28.hi;
      local_1f8.lo = (local_208 +
                     (-HVar28.hi - (local_1f8.hi - local_1e8)) +
                     (local_1e8 - (local_1f8.hi - (local_1f8.hi - local_1e8)))) - HVar28.lo;
      if (local_1f8.lo + local_1f8.hi < 0.0) {
        local_1f8.hi = 0.0;
        local_1f8.lo = 0.0;
      }
      uStack_1e0 = local_1b8._8_8_ ^ 0x8000000000000000;
      local_208 = (double)local_218._0_8_ - (double)local_1b8._0_8_;
      local_1e8 = (-(double)local_1b8._0_8_ - (local_208 - (double)local_218._0_8_)) +
                  ((double)local_218._0_8_ - (local_208 - (local_208 - (double)local_218._0_8_))) +
                  0.0;
      local_168.hi = local_208 + 1.0;
      uStack_200 = local_218._8_8_;
      local_168.lo = (1.0 - (local_168.hi - local_208)) +
                     (local_208 - (local_168.hi - (local_168.hi - local_208))) + local_1e8;
      HVar28 = HighsCDouble::operator*(&local_168,local_1d0.hi);
      local_1c0 = HVar28.lo;
      local_220 = HVar28.hi;
      local_e8 = local_168.hi * local_1d0.lo;
      dVar20 = floor(((double)local_1b8._0_8_ - (double)local_218._0_8_) + -0.5);
      local_218._0_8_ = dVar20;
      dVar20 = floor(local_208 + 0.5);
      local_1b8._0_8_ = dVar20;
      local_238.hi = local_208;
      local_238.lo = local_1e8;
      HVar28 = HighsCDouble::operator*(&local_238,local_1f8.hi);
      dVar23 = local_238.hi * local_1f8.lo;
      dVar26 = HVar28.hi + dVar23;
      dVar20 = (this->lambda).hi;
      dVar24 = dVar26 - dVar20;
      dVar25 = (this->lambda).lo;
      (this->rhs).hi = dVar24;
      (this->rhs).lo =
           ((-dVar20 - (dVar24 - dVar26)) + (dVar26 - (dVar24 - (dVar24 - dVar26))) +
           HVar28.lo + (HVar28.hi - (dVar26 - dVar23)) + (dVar23 - (dVar26 - (dVar26 - dVar23)))) -
           dVar25;
      this->integralSupport = true;
      this->integralCoefficients = false;
      if (this->rowlen != 0) {
        local_108 = (vector<int,_std::allocator<int>_> *)(uVar15 >> 4);
        local_d8 = local_220 + local_e8;
        local_1c0 = local_1c0 +
                    (local_220 - (local_d8 - local_e8)) +
                    (local_e8 - (local_d8 - (local_d8 - local_e8)));
        local_1b8._0_8_ = (long)(double)local_1b8._0_8_;
        lVar16 = (long)(int)(double)local_218._0_8_;
        local_140 = (double)(int)(double)local_218._0_8_;
        local_e8 = (double)(long)(int)(uint)local_108;
        uStack_d0 = 0;
        local_48._8_4_ = DAT_003be0d0._8_4_;
        local_48._0_8_ = (ulong)DAT_003be0d0 ^ (ulong)local_d8;
        local_48._12_4_ = DAT_003be0d0._12_4_;
        local_90 = (double)(ulong)((uint)local_108 & 0x7fffffff);
        local_80 = (long)local_90 + (ulong)(local_90 == 0.0);
        pdVar6 = this->vals;
        uVar15 = 0;
        local_170 = lVar16;
LAB_0027cee5:
        dVar20 = pdVar6[uVar15];
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          local_218._8_8_ = 0;
          local_218._0_8_ = dVar20;
          if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar15] == '\0') {
            if (0.0 <= dVar20) {
              pdVar6[uVar15] = 0.0;
            }
            else {
              this->integralSupport = false;
            }
          }
          else {
            if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar15] == '\0') {
              dVar20 = local_e8;
              if (0 < (int)local_108) {
                lVar13 = 0;
                do {
                  iVar7 = (int)(this->upper).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar13]];
                  if (-1 < iVar7) {
                    uVar12 = 0;
                    local_178 = (double)CONCAT44(local_178._4_4_,iVar7);
                    do {
                      pHVar10 = local_1a8.
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      local_188._0_8_ = uVar12;
                      local_208 = (double)(int)uVar12;
                      HVar28 = HighsCDouble::operator*
                                         (local_138.
                                          super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar13,
                                          local_208);
                      dVar20 = pHVar10[lVar13].hi;
                      dVar23 = HVar28.hi + dVar20;
                      local_110 = HVar28.lo +
                                  (HVar28.hi - (dVar23 - dVar20)) +
                                  (dVar20 - (dVar23 - (dVar23 - dVar20))) + pHVar10[lVar13].lo;
                      dVar20 = local_158.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar13].hi;
                      local_100.hi = dVar20 + local_208;
                      local_100.lo = (local_208 - (local_100.hi - dVar20)) +
                                     (dVar20 - (local_100.hi - (local_100.hi - dVar20))) +
                                     local_158.
                                     super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar13].lo;
                      dVar20 = dVar23 + local_138.
                                        super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar13].hi;
                      dVar25 = dVar20 - local_d8;
                      dVar20 = (((double)local_48._0_8_ - (dVar25 - dVar20)) +
                                (dVar20 - (dVar25 - (dVar25 - dVar20))) +
                               (local_138.
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar13].hi -
                               (dVar20 - dVar23)) + (dVar23 - (dVar20 - (dVar20 - dVar23))) +
                               local_110 +
                               local_138.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar13].lo) - local_1c0;
                      if ((double)local_218._0_8_ <= dVar25 + dVar20) {
                        HVar28 = HighsCDouble::operator*(&local_100,local_168.hi);
                        lVar16 = local_170;
                        dVar20 = local_100.hi * local_168.lo;
                        local_238.hi = HVar28.hi + dVar20;
                        local_238.lo = HVar28.lo +
                                       (HVar28.hi - (local_238.hi - dVar20)) +
                                       (dVar20 - (local_238.hi - (local_238.hi - dVar20)));
                        local_208 = local_1f8.lo;
                        local_218._0_8_ = local_1d0.lo;
                        local_220 = local_1d0.hi;
                        local_1e8 = local_1f8.hi;
                        uStack_1e0 = 0;
                        local_188._0_8_ = local_1d0.hi - local_1f8.hi;
                        HVar28 = HighsCDouble::operator*(&local_238,local_1d0.hi - local_1f8.hi);
                        dVar20 = HVar28.lo;
                        uVar18 = HVar28.hi._0_4_;
                        uVar19 = HVar28.hi._4_4_;
                        goto LAB_0027dd0b;
                      }
                      local_238.hi = (double)local_218._0_8_ - dVar25;
                      local_238.lo = (((double)local_218._0_8_ - (dVar25 + local_238.hi)) +
                                     (-dVar25 - (local_238.hi - (dVar25 + local_238.hi)))) - dVar20;
                      local_208 = dVar25;
                      uStack_200 = CONCAT44(extraout_XMM0_Dd_02,extraout_XMM0_Dc_02);
                      local_1e8 = dVar20;
                      local_a8 = dVar23;
                      uStack_a0 = CONCAT44(extraout_XMM0_Dd_02,extraout_XMM0_Dc_02);
                      HighsCDouble::operator/=(&local_238,&local_1d0);
                      lVar16 = (long)(local_238.hi + local_238.lo);
                      while( true ) {
                        if ((long)local_1b8._0_8_ < lVar16 + -1) break;
                        local_220 = (double)(lVar16 + -1);
                        HVar28 = HighsCDouble::operator*(&local_1d0,local_220);
                        dVar20 = local_208 + HVar28.hi;
                        dVar25 = dVar20 + local_1f8.hi;
                        if ((double)local_218._0_8_ <=
                            (local_1f8.hi - (dVar25 - dVar20)) +
                            (dVar20 - (dVar25 - (dVar25 - dVar20))) +
                            HVar28.lo +
                            (HVar28.hi - (dVar20 - local_208)) +
                            (local_208 - (dVar20 - (dVar20 - local_208))) + local_1e8 + local_1f8.lo
                            + dVar25) {
                          HVar28 = HighsCDouble::operator*(&local_100,local_168.hi);
                          lVar16 = local_170;
                          dVar25 = local_100.hi * local_168.lo;
                          dVar20 = HVar28.hi + dVar25;
                          local_238.hi = dVar20 + local_220;
                          local_238.lo = (local_220 - (local_238.hi - dVar20)) +
                                         (dVar20 - (local_238.hi - (local_238.hi - dVar20))) +
                                         HVar28.lo +
                                         (HVar28.hi - (dVar20 - dVar25)) +
                                         (dVar25 - (dVar20 - (dVar20 - dVar25)));
                          local_208 = local_1f8.lo;
                          local_218._0_8_ = local_1d0.lo;
                          local_220 = local_1d0.hi;
                          local_1e8 = local_1f8.hi;
                          uStack_1e0 = 0;
                          local_188._0_8_ = local_1d0.hi - local_1f8.hi;
                          HVar28 = HighsCDouble::operator*(&local_238,local_1d0.hi - local_1f8.hi);
                          dVar20 = HVar28.lo;
                          uVar18 = HVar28.hi._0_4_;
                          uVar19 = HVar28.hi._4_4_;
                          goto LAB_0027dd0b;
                        }
                        local_220 = (double)lVar16;
                        HVar28 = HighsCDouble::operator*(&local_1d0,local_220);
                        dVar20 = local_208 + HVar28.hi;
                        lVar16 = lVar16 + 1;
                        if ((double)local_218._0_8_ <=
                            HVar28.lo +
                            (HVar28.hi - (dVar20 - local_208)) +
                            (local_208 - (dVar20 - (dVar20 - local_208))) + local_1e8 + dVar20) {
                          HVar28 = HighsCDouble::operator*(&local_100,local_168.hi);
                          lVar16 = local_170;
                          dVar20 = local_100.hi * local_168.lo;
                          local_238.hi = HVar28.hi + dVar20;
                          local_238.lo = HVar28.lo +
                                         (HVar28.hi - (local_238.hi - dVar20)) +
                                         (dVar20 - (local_238.hi - (local_238.hi - dVar20)));
                          local_178 = local_1f8.lo;
                          local_208 = local_1d0.lo;
                          uStack_200 = 0;
                          local_118 = local_1d0.hi;
                          local_b8 = local_1f8.hi;
                          uStack_b0 = 0;
                          local_c8 = local_1d0.hi - local_1f8.hi;
                          HVar28 = HighsCDouble::operator*(&local_238,local_c8);
                          local_1e8 = HVar28.lo;
                          local_188._8_4_ = extraout_XMM0_Dc_04;
                          local_188._0_8_ = HVar28.hi;
                          local_188._12_4_ = extraout_XMM0_Dd_04;
                          local_88 = local_238.hi;
                          local_58 = local_138.
                                     super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar13].hi;
                          uStack_50 = 0;
                          local_120 = local_138.
                                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar13].lo;
                          HVar28 = HighsCDouble::operator*(&local_1f8,local_220);
                          dVar21 = ((local_208 +
                                    (local_118 - (local_c8 - (local_c8 - local_118))) +
                                    (-local_b8 - (local_c8 - local_118))) - local_178) * local_88;
                          dVar24 = (double)local_188._0_8_ + dVar21;
                          dVar23 = (double)local_218._0_8_ + dVar24;
                          dVar26 = dVar23 - local_a8;
                          dVar22 = dVar26 - local_58;
                          dVar20 = local_d8 + dVar22;
                          dVar25 = dVar20 - HVar28.hi;
                          dVar25 = ((((dVar25 - dVar20) - dVar25) + dVar20 +
                                     (-HVar28.hi - (dVar25 - dVar20)) +
                                    ((((((dVar26 - dVar23) - dVar26) + dVar23 +
                                        (-local_a8 - (dVar26 - dVar23)) +
                                       (dVar24 - (dVar23 - (dVar23 - dVar24))) +
                                       ((double)local_218._0_8_ - (dVar23 - dVar24)) +
                                       local_1e8 +
                                       (dVar21 - (dVar24 - (dVar24 - dVar21))) +
                                       ((double)local_188._0_8_ - (dVar24 - dVar21))) - local_110) +
                                     ((dVar22 - dVar26) - dVar22) + dVar26 +
                                     (-local_58 - (dVar22 - dVar26))) - local_120) +
                                    ((dVar20 - dVar22) - dVar20) + dVar22 +
                                    (local_d8 - (dVar20 - dVar22)) + local_1c0) - HVar28.lo) +
                                   dVar25;
                          goto LAB_0027dd81;
                        }
                      }
                      uVar12 = (ulong)(local_188._0_4_ + 1);
                    } while (local_188._0_4_ != local_178._0_4_);
                  }
                  lVar13 = lVar13 + 1;
                  dVar20 = local_90;
                } while (lVar13 != local_80);
              }
              dVar25 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)dVar20].hi;
              local_238.hi = (double)local_218._0_8_ - dVar25;
              local_238.lo = (((double)local_218._0_8_ - (dVar25 + local_238.hi)) +
                             (-dVar25 - (local_238.hi - (dVar25 + local_238.hi)))) -
                             local_1a8.
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                             .super__Vector_impl_data._M_start[(long)dVar20].lo;
              HighsCDouble::operator/=(&local_238,&local_1d0);
              lVar16 = (long)(local_238.hi + local_238.lo);
LAB_0027d438:
              pHVar10 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_208 = (double)(lVar16 + -1);
              HVar28 = HighsCDouble::operator*(&local_1d0,local_208);
              dVar25 = local_e8;
              pHVar4 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              dVar20 = pHVar10[(long)local_e8].hi;
              dVar26 = HVar28.hi + dVar20;
              dVar23 = dVar26 + local_1f8.hi;
              if ((local_1f8.hi - (dVar23 - dVar26)) + (dVar26 - (dVar23 - (dVar23 - dVar26))) +
                  HVar28.lo +
                  (HVar28.hi - (dVar26 - dVar20)) + (dVar20 - (dVar26 - (dVar26 - dVar20))) +
                  pHVar10[(long)local_e8].lo + local_1f8.lo + dVar23 < (double)local_218._0_8_)
              goto code_r0x0027d4e0;
              pHVar17 = local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                        _M_impl.super__Vector_impl_data._M_start + (long)local_e8;
              HVar28 = HighsCDouble::operator*(pHVar17,local_168.hi);
              lVar16 = local_170;
              dVar25 = pHVar17->hi * local_168.lo;
              dVar20 = HVar28.hi + dVar25;
              local_238.hi = dVar20 + local_208;
              local_238.lo = (local_208 - (local_238.hi - dVar20)) +
                             (dVar20 - (local_238.hi - (local_238.hi - dVar20))) +
                             HVar28.lo +
                             (HVar28.hi - (dVar20 - dVar25)) +
                             (dVar25 - (dVar20 - (dVar20 - dVar25)));
              local_208 = local_1f8.lo;
              local_218._0_8_ = local_1d0.lo;
              local_220 = local_1d0.hi;
              local_1e8 = local_1f8.hi;
              uStack_1e0 = 0;
              local_188._0_8_ = local_1d0.hi - local_1f8.hi;
              HVar28 = HighsCDouble::operator*(&local_238,local_1d0.hi - local_1f8.hi);
              dVar20 = HVar28.lo;
              uVar18 = HVar28.hi._0_4_;
              uVar19 = HVar28.hi._4_4_;
LAB_0027dd0b:
              dVar23 = (((double)local_218._0_8_ +
                        (local_220 -
                        ((double)local_188._0_8_ - ((double)local_188._0_8_ - local_220))) +
                        (-local_1e8 - ((double)local_188._0_8_ - local_220))) - local_208) *
                       local_238.hi;
              dVar25 = (double)CONCAT44(uVar19,uVar18) + dVar23;
              dVar25 = dVar20 + ((double)CONCAT44(uVar19,uVar18) - (dVar25 - dVar23)) +
                                (dVar23 - (dVar25 - (dVar25 - dVar23))) + dVar25;
              goto LAB_0027dd81;
            }
            uVar18 = SUB84(local_1d0.hi,0);
            uVar19 = (undefined4)((ulong)local_1d0.hi >> 0x20);
            local_218._8_8_ = 0x8000000000000000;
            local_218._0_8_ = -dVar20;
            lVar13 = (long)(-dVar20 / (local_1d0.hi + local_1d0.lo));
            if (-2 < lVar13) {
              lVar13 = -1;
            }
            if (lVar16 <= lVar13) {
              do {
                local_208 = (double)lVar13;
                HVar28 = HighsCDouble::operator*(&local_1d0,local_208);
                dVar20 = HVar28.hi;
                dVar25 = dVar20 + local_1f8.hi;
                if (HVar28.lo +
                    (local_1f8.hi - (dVar25 - dVar20)) + (dVar20 - (dVar25 - (dVar25 - dVar20))) +
                    local_1f8.lo + dVar25 <= (double)local_218._0_8_) {
                  HVar28 = HighsCDouble::operator*(&local_1f8,(double)(lVar13 + 1));
                  dVar20 = HVar28.hi;
                  dVar25 = (double)local_218._0_8_ - dVar20;
                  dVar25 = ((((double)local_218._0_8_ - (dVar20 + dVar25)) +
                            (-dVar20 - (dVar25 - (dVar20 + dVar25)))) - HVar28.lo) + dVar25;
                  goto LAB_0027dbcd;
                }
                HVar28 = HighsCDouble::operator*(&local_1d0,local_208);
                if (HVar28.hi + HVar28.lo <= (double)local_218._0_8_) {
                  local_238.hi = local_1d0.hi - local_1f8.hi;
                  local_238.lo = ((-local_1f8.hi - (local_238.hi - local_1d0.hi)) +
                                  (local_1d0.hi - (local_238.hi - (local_238.hi - local_1d0.hi))) +
                                 local_1d0.lo) - local_1f8.lo;
                  HVar28 = HighsCDouble::operator*(&local_238,local_208);
                  dVar25 = HVar28.lo;
                  uVar18 = HVar28.hi._0_4_;
                  uVar19 = HVar28.hi._4_4_;
                  goto LAB_0027dbc5;
                }
                bVar3 = lVar16 < lVar13;
                lVar13 = lVar13 + -1;
              } while (bVar3);
              uVar18 = SUB84(local_1d0.hi,0);
              uVar19 = (undefined4)((ulong)local_1d0.hi >> 0x20);
            }
            local_238.hi = (double)CONCAT44(uVar19,uVar18) - local_1f8.hi;
            dVar20 = local_238.hi - (double)CONCAT44(uVar19,uVar18);
            local_238.lo = ((-local_1f8.hi - dVar20) +
                            ((double)CONCAT44(uVar19,uVar18) - (local_238.hi - dVar20)) +
                           local_1d0.lo) - local_1f8.lo;
            HVar28 = HighsCDouble::operator*(&local_238,local_140);
            dVar25 = HVar28.lo;
            uVar18 = HVar28.hi._0_4_;
            uVar19 = HVar28.hi._4_4_;
LAB_0027dbc5:
            dVar25 = (double)CONCAT44(uVar19,uVar18) + dVar25;
LAB_0027dbcd:
            pdVar6 = this->vals;
            pdVar6[uVar15] = -dVar25;
            dVar25 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15] * -dVar25;
            dVar20 = (this->rhs).hi;
            dVar23 = dVar20 + dVar25;
            (this->rhs).hi = dVar23;
            (this->rhs).lo =
                 (dVar20 - (dVar23 - dVar25)) + (dVar25 - (dVar23 - (dVar23 - dVar25))) +
                 (this->rhs).lo;
          }
        }
        goto LAB_0027dd92;
      }
LAB_0027de56:
      uVar15 = (ulong)local_ec;
    }
    uVar9 = (undefined1)uVar15;
    if (local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0027de73;
  }
  operator_delete(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_0027de73:
  if (local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)uVar9;
code_r0x0027d4e0:
  local_208 = (double)lVar16;
  HVar28 = HighsCDouble::operator*(&local_1d0,local_208);
  dVar20 = pHVar4[(long)dVar25].hi;
  dVar23 = HVar28.hi + dVar20;
  lVar16 = lVar16 + 1;
  if ((double)local_218._0_8_ <=
      HVar28.lo +
      (HVar28.hi - (dVar23 - dVar20)) + (dVar20 - (dVar23 - (dVar23 - dVar20))) +
      pHVar4[(long)dVar25].lo + dVar23) goto code_r0x0027d547;
  goto LAB_0027d438;
code_r0x0027d547:
  pHVar17 = local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start + (long)dVar25;
  HVar28 = HighsCDouble::operator*(pHVar17,local_168.hi);
  lVar16 = local_170;
  dVar20 = pHVar17->hi * local_168.lo;
  local_238.hi = HVar28.hi + dVar20;
  local_238.lo = HVar28.lo +
                 (HVar28.hi - (local_238.hi - dVar20)) +
                 (dVar20 - (local_238.hi - (local_238.hi - dVar20)));
  local_110 = local_1f8.lo;
  local_1e8 = local_1d0.lo;
  uStack_1e0 = 0;
  local_178 = local_1d0.hi;
  local_a8 = local_1f8.hi;
  uStack_a0 = 0;
  local_b8 = local_1d0.hi - local_1f8.hi;
  HVar28 = HighsCDouble::operator*(&local_238,local_b8);
  local_220 = HVar28.lo;
  local_188._8_4_ = extraout_XMM0_Dc_03;
  local_188._0_8_ = HVar28.hi;
  local_188._12_4_ = extraout_XMM0_Dd_03;
  local_120 = local_238.hi;
  local_c8 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start[(long)dVar25].hi;
  uStack_c0 = 0;
  local_118 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_start[(long)dVar25].lo;
  HVar28 = HighsCDouble::operator*(&local_1f8,local_208);
  dVar24 = ((local_1e8 +
            (local_178 - (local_b8 - (local_b8 - local_178))) + (-local_a8 - (local_b8 - local_178))
            ) - local_110) * local_120;
  dVar20 = (double)local_188._0_8_ + dVar24;
  dVar26 = (double)local_218._0_8_ + dVar20;
  dVar23 = dVar26 - local_c8;
  dVar25 = dVar23 - HVar28.hi;
  dVar25 = ((((dVar25 - dVar23) - dVar25) + dVar23 + (-HVar28.hi - (dVar25 - dVar23)) +
            ((((dVar23 - dVar26) - dVar23) + dVar26 + (-local_c8 - (dVar23 - dVar26)) +
             (dVar20 - (dVar26 - (dVar26 - dVar20))) + ((double)local_218._0_8_ - (dVar26 - dVar20))
             + local_220 +
               (dVar24 - (dVar20 - (dVar20 - dVar24))) +
               ((double)local_188._0_8_ - (dVar20 - dVar24))) - local_118)) - HVar28.lo) + dVar25;
LAB_0027dd81:
  pdVar6 = this->vals;
  pdVar6[uVar15] = dVar25;
LAB_0027dd92:
  uVar15 = uVar15 + 1;
  if (uVar15 == (uint)this->rowlen) goto LAB_0027de56;
  goto LAB_0027cee5;
}

Assistant:

bool HighsCutGeneration::separateLiftedMixedIntegerCover() {
  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  HighsInt coversize = cover.size();

  HighsInt l = -1;

  std::vector<uint8_t> coverflag;
  coverflag.resize(rowlen);
  for (HighsInt i : cover) coverflag[i] = 1;

  auto comp = [&](HighsInt a, HighsInt b) { return vals[a] > vals[b]; };
  pdqsort_branchless(cover.begin(), cover.end(), comp);

  std::vector<HighsCDouble> a;
  std::vector<HighsCDouble> u;
  std::vector<HighsCDouble> m;

  a.resize(coversize);
  u.resize(coversize + 1);
  m.resize(coversize + 1);

  HighsCDouble usum = 0.0;
  HighsCDouble msum = 0.0;
  // set up the partial sums of the upper bounds, and the contributions
  for (HighsInt c = 0; c != coversize; ++c) {
    HighsInt i = cover[c];

    u[c] = usum;
    m[c] = msum;
    a[c] = vals[i];
    double ub = upper[i];
    usum += ub;
    msum += ub * a[c];
  }

  u[coversize] = usum;
  m[coversize] = msum;

  // determine which variable in the cover we want to create the MIR inequality
  // from which we lift we try to select a variable to have the highest chance
  // of satisfying the facet conditions for the superadditive lifting function
  // gamma to be satisfied.
  HighsInt lpos = -1;
  HighsInt bestlCplusend = -1;
  double bestlVal = 0.0;
  bool bestlAtUpper = true;

  for (HighsInt i = 0; i != coversize; ++i) {
    HighsInt j = cover[i];
    double ub = upper[j];

    bool atUpper = solval[j] >= ub - feastol;
    if (atUpper && !bestlAtUpper) continue;

    double mju = ub * vals[j];
    HighsCDouble mu = mju - lambda;

    if (mu <= 10 * feastol) continue;
    if (std::abs(vals[j]) < 1000 * feastol) continue;

    double mudival = double(mu / vals[j]);
    if (HighsIntegers::isIntegral(mudival, feastol)) continue;
    double eta = ceil(mudival);

    HighsCDouble ulminusetaplusone = HighsCDouble(ub) - eta + 1.0;
    HighsCDouble cplusthreshold = ulminusetaplusone * vals[j];

    HighsInt cplusend =
        std::upper_bound(cover.begin(), cover.end(), double(cplusthreshold),
                         [&](double cplusthreshold, HighsInt i) {
                           return cplusthreshold > vals[i];
                         }) -
        cover.begin();

    HighsCDouble mcplus = m[cplusend];
    if (i < cplusend) mcplus -= mju;

    double jlVal = double(mcplus + eta * vals[j]);

    if (jlVal > bestlVal || (!atUpper && bestlAtUpper)) {
      lpos = i;
      bestlCplusend = cplusend;
      bestlVal = jlVal;
      bestlAtUpper = atUpper;
    }
  }

  if (lpos == -1) return false;

  l = cover[lpos];
  HighsCDouble al = vals[l];
  double upperl = upper[l];
  HighsCDouble mlu = upperl * al;
  HighsCDouble mu = mlu - lambda;

  a.resize(bestlCplusend);
  cover.resize(bestlCplusend);
  u.resize(bestlCplusend + 1);
  m.resize(bestlCplusend + 1);

  if (lpos < bestlCplusend) {
    a.erase(a.begin() + lpos);
    cover.erase(cover.begin() + lpos);
    u.erase(u.begin() + lpos + 1);
    m.erase(m.begin() + lpos + 1);
    for (HighsInt i = lpos + 1; i < bestlCplusend; ++i) {
      u[i] -= upperl;
      m[i] -= mlu;
    }
  }

  HighsInt cplussize = a.size();

  assert(mu > 10 * feastol);

  double mudival = double(mu / al);
  double eta = ceil(mudival);
  HighsCDouble r = mu - floor(mudival) * HighsCDouble(al);
  // we multiply with r and it is important that it does not flip the sign
  // so we safe guard against tiny numerical errors here
  if (r < 0) r = 0;

  HighsCDouble ulminusetaplusone = HighsCDouble(upperl) - eta + 1.0;
  HighsCDouble cplusthreshold = ulminusetaplusone * al;

  HighsInt kmin = floor(eta - upperl - 0.5);

  auto phi_l = [&](double a) {
    assert(a < 0);

    int64_t k = std::min(int64_t(a / double(al)), int64_t(-1));

    for (; k >= kmin; --k) {
      if (a >= k * al + r) {
        assert(a < (k + 1) * al);
        return double(a - (k + 1) * r);
      }

      if (a >= k * al) {
        assert(a < k * al + r);
        return double(k * (al - r));
      }
    }

    assert(a <= -lambda + epsilon);
    return double(kmin * (al - r));
  };

  int64_t kmax = floor(upperl - eta + 0.5);

  auto gamma_l = [&](double z) {
    assert(z > 0);
    for (HighsInt i = 0; i < cplussize; ++i) {
      HighsInt upperi = upper[cover[i]];

      for (HighsInt h = 0; h <= upperi; ++h) {
        HighsCDouble mih = m[i] + h * a[i];
        HighsCDouble uih = u[i] + h;
        HighsCDouble mihplusdeltai = mih + a[i] - cplusthreshold;
        if (z <= mihplusdeltai) {
          assert(mih <= z + epsilon);
          return double(uih * ulminusetaplusone * (al - r));
        }

        int64_t k = ((int64_t)(double)((z - mihplusdeltai) / al)) - 1;
        for (; k <= kmax; ++k) {
          if (z <= mihplusdeltai + k * al + r) {
            assert(mihplusdeltai + k * al <= z);
            return double((uih * ulminusetaplusone + k) * (al - r));
          }

          if (z <= mihplusdeltai + (k + 1) * al) {
            assert(mihplusdeltai + k * al + r <= z);
            return double((uih * ulminusetaplusone) * (al - r) + z - mih -
                          a[i] + cplusthreshold - (k + 1) * r);
          }
        }
      }
    }

    int64_t p = ((int64_t)(double)((z - m[cplussize]) / al)) - 1;
    for (;; ++p) {
      if (z <= m[cplussize] + p * al + r) {
        assert(m[cplussize] + p * al <= z);
        return double((u[cplussize] * ulminusetaplusone + p) * (al - r));
      }

      if (z <= m[cplussize] + (p + 1) * al) {
        assert(m[cplussize] + p * al + r <= z);
        return double((u[cplussize] * ulminusetaplusone) * (al - r) + z -
                      m[cplussize] - (p + 1) * r);
      }
    }
  };

  rhs = (HighsCDouble(upperl) - eta) * r - lambda;
  integralSupport = true;
  integralCoefficients = false;
  for (HighsInt i = 0; i != rowlen; ++i) {
    if (vals[i] == 0.0) continue;
    if (!isintegral[i]) {
      if (vals[i] < 0.0)
        integralSupport = false;
      else
        vals[i] = 0.0;
      continue;
    }

    if (coverflag[i]) {
      vals[i] = -phi_l(-vals[i]);
      rhs += vals[i] * upper[i];
    } else {
      vals[i] = gamma_l(vals[i]);
    }
  }

  return true;
}